

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inet_net_pton.c
# Opt level: O3

int ares_inet_net_pton_ipv4(char *src,uchar *dst,size_t size)

{
  byte bVar1;
  bool bVar2;
  byte bVar3;
  uint uVar4;
  void *pvVar5;
  int *piVar6;
  ulong uVar7;
  size_t sVar8;
  uint uVar9;
  uchar *puVar10;
  byte *pbVar11;
  long lVar12;
  char cVar13;
  uint uVar14;
  byte *pbVar15;
  int iVar16;
  int iVar17;
  bool bVar18;
  uchar *local_38;
  
  memset(dst,0,size);
  pbVar15 = (byte *)(src + 1);
  bVar3 = *src;
  local_38 = dst;
  if (bVar3 == 0x30) {
    if ((((*pbVar15 | 0x20) == 0x78) && (bVar1 = src[2], -1 < (char)bVar1)) &&
       ((uVar4 = (uint)bVar1, (byte)(bVar1 - 0x30) < 10 ||
        ((bVar1 - 0x41 < 0x26 && ((0x3f0000003fU >> ((ulong)(bVar1 - 0x41) & 0x3f) & 1) != 0)))))) {
      iVar16 = 0x5a;
      if (size == 0) goto LAB_00119e2f;
      pbVar15 = (byte *)(src + 3);
      bVar18 = false;
      uVar14 = 0;
      do {
        cVar13 = (char)uVar14;
        bVar3 = (byte)uVar4;
        if (9 < (byte)(bVar3 - 0x30)) {
          if (5 < (byte)((bVar3 & 0x5f) + 0xbf)) break;
          if (bVar3 < 0x5b) {
            bVar3 = ares_tolower(bVar3);
            uVar4 = (uint)bVar3;
          }
        }
        pvVar5 = memchr("0123456789abcdef",uVar4,0x11);
        uVar4 = (int)pvVar5 - 0x129920;
        uVar9 = uVar14 << 4 | uVar4;
        uVar14 = uVar4;
        if (bVar18) {
          uVar14 = uVar9;
        }
        cVar13 = (char)uVar14;
        bVar2 = true;
        if (bVar18) {
          if (size == 0) goto LAB_00119e2f;
          size = size - 1;
          *local_38 = (uchar)uVar9;
          local_38 = local_38 + 1;
          bVar2 = false;
        }
        bVar18 = bVar2;
        bVar3 = *pbVar15;
        uVar4 = (uint)(char)bVar3;
        pbVar15 = pbVar15 + 1;
      } while ('\0' < (char)bVar3);
      if (bVar18) {
        if (size == 0) goto LAB_00119e2f;
        size = size - 1;
        *local_38 = cVar13 << 4;
        local_38 = local_38 + 1;
      }
LAB_00119cf2:
      iVar16 = 2;
      if (uVar4 == 0) {
        if (local_38 == dst) goto LAB_00119e2f;
LAB_00119d95:
        bVar3 = *dst;
        uVar7 = 0x20;
        if (((bVar3 < 0xf0) && (uVar7 = 8, bVar3 < 0xe0)) && (uVar7 = 0x18, bVar3 < 0xc0)) {
          uVar7 = (ulong)((uint)(bVar3 >> 7) * 8 + 8);
        }
        lVar12 = ((long)local_38 - (long)dst) * 8;
        iVar17 = (int)((long)local_38 - (long)dst) << 3;
        if (lVar12 - uVar7 == 0 || lVar12 < (long)uVar7) {
          iVar17 = (int)uVar7;
        }
        if (iVar17 == 8) {
          iVar17 = (uint)(bVar3 != 0xe0) * 4 + 4;
        }
      }
      else {
        if (((uVar4 != 0x2f) || (bVar3 = *pbVar15, 9 < (byte)(bVar3 - 0x30))) ||
           (local_38 < dst || (long)local_38 - (long)dst == 0)) goto LAB_00119e2f;
        iVar17 = 0;
        do {
          pbVar15 = pbVar15 + 1;
          pvVar5 = memchr("0123456789",(uint)bVar3,0xb);
          iVar17 = (int)pvVar5 + -0x129931 + iVar17 * 10;
          if (0x20 < iVar17) goto LAB_00119e2f;
          bVar3 = *pbVar15;
        } while ((byte)(bVar3 - 0x30) < 10);
        if (bVar3 != 0) goto LAB_00119e2f;
        if (iVar17 == -1) goto LAB_00119d95;
        lVar12 = ((long)local_38 - (long)dst) * 8;
      }
      if (iVar17 <= lVar12) {
        return iVar17;
      }
      sVar8 = 0;
      puVar10 = local_38;
      while (size != sVar8) {
        puVar10 = puVar10 + 1;
        local_38[sVar8] = '\0';
        sVar8 = sVar8 + 1;
        if ((long)iVar17 <= ((long)puVar10 - (long)dst) * 8) {
          return iVar17;
        }
      }
LAB_00119e29:
      iVar16 = 0x5a;
      goto LAB_00119e2f;
    }
  }
  else {
    iVar16 = 2;
    if (9 < (byte)(bVar3 - 0x30)) goto LAB_00119e2f;
  }
  iVar16 = 2;
  do {
    uVar4 = (uint)bVar3;
    iVar17 = 0;
    do {
      pbVar11 = pbVar15;
      pvVar5 = memchr("0123456789",uVar4,0xb);
      iVar17 = (int)pvVar5 + -0x129931 + iVar17 * 10;
      if (0xff < iVar17) goto LAB_00119e2f;
      bVar3 = *pbVar11;
      uVar4 = (uint)(char)bVar3;
      pbVar15 = pbVar11 + 1;
    } while ((byte)(bVar3 - 0x30) < 10);
    bVar18 = size == 0;
    size = size - 1;
    if (bVar18) goto LAB_00119e29;
    *local_38 = (uchar)iVar17;
    local_38 = local_38 + 1;
    if (bVar3 != 0x2e) {
      if ((bVar3 == 0) || (bVar3 == 0x2f)) goto LAB_00119cf2;
      break;
    }
    bVar3 = *pbVar15;
    pbVar15 = pbVar11 + 2;
  } while ((byte)(bVar3 - 0x30) < 10);
LAB_00119e2f:
  piVar6 = __errno_location();
  *piVar6 = iVar16;
  return -1;
}

Assistant:

static int ares_inet_net_pton_ipv4(const char *src, unsigned char *dst,
                                   size_t size)
{
  static const char    xdigits[] = "0123456789abcdef";
  static const char    digits[]  = "0123456789";
  int                  n;
  int                  ch;
  int                  tmp = 0;
  int                  dirty;
  int                  bits;
  const unsigned char *odst = dst;

  memset(dst, 0, size);
  ch = *src++;
  if (ch == '0' && (src[0] == 'x' || src[0] == 'X') && ares_isascii(src[1]) &&
      ares_isxdigit(src[1])) {
    /* Hexadecimal: Eat nybble string. */
    if (!size) {
      goto emsgsize;
    }
    dirty = 0;
    src++; /* skip x or X. */
    while ((ch = *src++) != '\0' && ares_isascii(ch) && ares_isxdigit(ch)) {
      if (ares_isupper(ch)) {
        ch = ares_tolower((unsigned char)ch);
      }
      n = (int)(strchr(xdigits, ch) - xdigits);
      if (dirty == 0) {
        tmp = n;
      } else {
        tmp = (tmp << 4) | n;
      }
      if (++dirty == 2) {
        if (!size--) {
          goto emsgsize;
        }
        *dst++ = (unsigned char)tmp;
        dirty  = 0;
      }
    }
    if (dirty) { /* Odd trailing nybble? */
      if (!size--) {
        goto emsgsize;
      }
      *dst++ = (unsigned char)(tmp << 4);
    }
  } else if (ares_isascii(ch) && ares_isdigit(ch)) {
    /* Decimal: eat dotted digit string. */
    for (;;) {
      tmp = 0;
      do {
        n    = (int)(strchr(digits, ch) - digits);
        tmp *= 10;
        tmp += n;
        if (tmp > 255) {
          goto enoent;
        }
      } while ((ch = *src++) != '\0' && ares_isascii(ch) && ares_isdigit(ch));
      if (!size--) {
        goto emsgsize;
      }
      *dst++ = (unsigned char)tmp;
      if (ch == '\0' || ch == '/') {
        break;
      }
      if (ch != '.') {
        goto enoent;
      }
      ch = *src++;
      if (!ares_isascii(ch) || !ares_isdigit(ch)) {
        goto enoent;
      }
    }
  } else {
    goto enoent;
  }

  bits = -1;
  if (ch == '/' && ares_isascii(src[0]) && ares_isdigit(src[0]) && dst > odst) {
    /* CIDR width specifier.  Nothing can follow it. */
    ch   = *src++; /* Skip over the /. */
    bits = 0;
    do {
      n     = (int)(strchr(digits, ch) - digits);
      bits *= 10;
      bits += n;
      if (bits > 32) {
        goto enoent;
      }
    } while ((ch = *src++) != '\0' && ares_isascii(ch) && ares_isdigit(ch));
    if (ch != '\0') {
      goto enoent;
    }
  }

  /* Firey death and destruction unless we prefetched EOS. */
  if (ch != '\0') {
    goto enoent;
  }

  /* If nothing was written to the destination, we found no address. */
  if (dst == odst) {
    goto enoent; /* LCOV_EXCL_LINE: all valid paths above increment dst */
  }
  /* If no CIDR spec was given, infer width from net class. */
  if (bits == -1) {
    if (*odst >= 240) {        /* Class E */
      bits = 32;
    } else if (*odst >= 224) { /* Class D */
      bits = 8;
    } else if (*odst >= 192) { /* Class C */
      bits = 24;
    } else if (*odst >= 128) { /* Class B */
      bits = 16;
    } else {                   /* Class A */
      bits = 8;
    }
    /* If imputed mask is narrower than specified octets, widen. */
    if (bits < ((dst - odst) * 8)) {
      bits = (int)(dst - odst) * 8;
    }
    /*
     * If there are no additional bits specified for a class D
     * address adjust bits to 4.
     */
    if (bits == 8 && *odst == 224) {
      bits = 4;
    }
  }
  /* Extend network to cover the actual mask. */
  while (bits > ((dst - odst) * 8)) {
    if (!size--) {
      goto emsgsize;
    }
    *dst++ = '\0';
  }
  return bits;

enoent:
  SET_SOCKERRNO(ENOENT);
  return -1;

emsgsize:
  SET_SOCKERRNO(EMSGSIZE);
  return -1;
}